

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 207_courseSchedule.cpp
# Opt level: O0

bool canFinish(int numCourses,
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *prereq)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  reference __x;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  reference piVar6;
  ostream *poVar7;
  undefined8 uStack_160;
  vector<int,_std::allocator<int>_> vStack_158;
  vector<int,_std::allocator<int>_> *local_140;
  vector<int,_std::allocator<int>_> *local_138;
  undefined1 local_129;
  ostream *local_128;
  ostream *local_120;
  ostream *local_118;
  ostream *local_110;
  vector<int,_std::allocator<int>_> *local_108;
  vector<int,_std::allocator<int>_> *local_100;
  vector<int,_std::allocator<int>_> *local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  ulong local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  size_type local_d0;
  allocator_type *local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  int i_1;
  int s_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_90 [4];
  int i;
  vector<int,_std::allocator<int>_> s;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  unsigned_long __vla_expr0;
  allocator<int> local_3d;
  value_type local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> vis;
  int n;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *prereq_local;
  int numCourses_local;
  
  local_d0 = (size_type)numCourses;
  local_3c = 0;
  local_c8 = &local_3d;
  uStack_160 = 0x10546a;
  vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = numCourses;
  std::allocator<int>::allocator(local_c8);
  uStack_160 = 0x105485;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,local_d0,&local_3c,local_c8);
  uStack_160 = 0x105490;
  std::allocator<int>::~allocator(&local_3d);
  local_e0 = (ulong)vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
  lVar1 = -(local_e0 * 0x18 + 0xf & 0xfffffffffffffff0);
  local_d8 = (vector<int,_std::allocator<int>_> *)((long)&vStack_158 + lVar1);
  if (local_e0 != 0) {
    local_f0 = local_d8 + local_e0;
    local_e8 = local_d8;
    do {
      pvVar5 = local_e8;
      local_f8 = local_e8;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105504;
      std::vector<int,_std::allocator<int>_>::vector(pvVar5);
      local_e8 = local_f8 + 1;
    } while (local_e8 != local_f0);
  }
  *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105533;
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin(prereq);
  *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105540;
  s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::end(prereq);
  while( true ) {
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105551;
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) break;
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105563;
    __x = __gnu_cxx::
          __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          ::operator*(&__end1);
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105572;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_90,__x);
    local_108 = (vector<int,_std::allocator<int>_> *)local_90;
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x10558b;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_90,0);
    pvVar5 = local_108;
    local_100 = local_d8 + *pvVar4;
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1055b8;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,1);
    pvVar5 = local_100;
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1055c7;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar5,pvVar4);
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1055d5;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1055de;
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  for (__range2._4_4_ = 0;
      __range2._4_4_ <
      (int)vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_; __range2._4_4_ = __range2._4_4_ + 1) {
    pvVar5 = local_d8 + __range2._4_4_;
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x10566c;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x10567f;
    _i_1 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
    while( true ) {
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105699;
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&i_1);
      if (!bVar3) break;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1056ae;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_b4 = *piVar6;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1056c9;
      poVar7 = std::operator<<((ostream *)&std::cout,"index : ");
      local_110 = poVar7;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1056e4;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,__range2._4_4_);
      local_118 = poVar7;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105700;
      poVar7 = std::operator<<(poVar7,":");
      iVar2 = local_b4;
      local_120 = poVar7;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x10571b;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
      local_128 = poVar7;
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105737;
      std::operator<<(poVar7," ");
      *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105747;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x10575f;
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_b8 = 0;
  do {
    iVar2 = local_b8;
    pvVar5 = local_d8;
    if ((int)vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ <= local_b8) {
      prereq_local._7_1_ = true;
LAB_001057e7:
      local_bc = 1;
      local_138 = local_d8 + local_e0;
      if (local_d8 != local_138) {
        do {
          pvVar5 = local_138 + -1;
          local_140 = pvVar5;
          *(undefined8 *)((long)&uStack_160 + lVar1) = 0x105822;
          std::vector<int,_std::allocator<int>_>::~vector(pvVar5);
          local_138 = local_140;
        } while (local_140 != local_d8);
      }
      uStack_160 = 0x10584c;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
      ;
      return prereq_local._7_1_;
    }
    *(undefined8 *)((long)&uStack_160 + lVar1) = 0x1057a2;
    local_129 = cycle(pvVar5,(vector<int,_std::allocator<int>_> *)local_38,iVar2);
    if ((bool)local_129) {
      prereq_local._7_1_ = false;
      goto LAB_001057e7;
    }
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

bool canFinish(int numCourses, vector<vector<int>>& prereq) {
    int n=numCourses;
    vector<int> vis(n,0);
    vector<int> adj[n];
    for (auto s : prereq)
    {
        adj[s[0]].push_back(s[1]);
    }
    for (int i=0;i<n;i++)
    {
    	for (auto s: adj[i])
    		cout<<"index : "<<i<<":"<<s<<" ";
    	cout<<endl;
    }
    for (int i=0;i<n;i++)
    {
        if (cycle(adj,vis,i))
            return false;
    }
    return true;
}